

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timedependent.cxx
# Opt level: O1

bool __thiscall Time::step(Time *this)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  byte bVar4;
  byte bVar5;
  int iVar6;
  bool bVar7;
  
  do {
    iVar6 = (int)((ulong)((long)(this->timeObjects).
                                super__Vector_base<TimeDependent_*,_std::allocator<TimeDependent_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->timeObjects).
                               super__Vector_base<TimeDependent_*,_std::allocator<TimeDependent_*>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 3);
    if (iVar6 == 0) {
      bVar5 = 1;
      bVar3 = true;
    }
    else {
      bVar2 = true;
      bVar3 = true;
      bVar5 = 0;
      bVar4 = 0;
      do {
        iVar6 = iVar6 + -1;
        iVar1 = (*(this->timeObjects).
                  super__Vector_base<TimeDependent_*,_std::allocator<TimeDependent_*>_>._M_impl.
                  super__Vector_impl_data._M_start[iVar6]->_vptr_TimeDependent[5])();
        if ((char)iVar1 == '\0') {
          (*(this->timeObjects).
            super__Vector_base<TimeDependent_*,_std::allocator<TimeDependent_*>_>._M_impl.
            super__Vector_impl_data._M_start[iVar6]->_vptr_TimeDependent[3])();
          iVar1 = (*(this->timeObjects).
                    super__Vector_base<TimeDependent_*,_std::allocator<TimeDependent_*>_>._M_impl.
                    super__Vector_impl_data._M_start[iVar6]->_vptr_TimeDependent[5])();
          bVar7 = (char)iVar1 != '\0';
          bVar4 = bVar5;
          if (bVar7) {
            bVar4 = 1;
          }
          bVar5 = bVar4;
          bVar3 = bVar2;
          if (!bVar7) {
            bVar2 = false;
            bVar3 = false;
          }
        }
      } while (iVar6 != 0);
      bVar5 = bVar4 ^ 1 | bVar3;
    }
  } while (bVar5 == 0);
  if (bVar3 != false) {
    this->timePassed = this->dt + this->timePassed;
  }
  return bVar3;
}

Assistant:

bool Time::step()
{
	// saving flags for update success
	bool someObjectsUpdated = true;
	bool allObjectsUpdated = false;
		
	// while some objects are waiting, but some can still be updated
	while (someObjectsUpdated && !allObjectsUpdated) {
		someObjectsUpdated = false;
		allObjectsUpdated = true;
		
		// try to update all waiting objects
		for (int i=timeObjects.size()-1; i+1; --i) {
			if (!timeObjects[i]->isNextStatePrepared()) {
				
				// update object
				timeObjects[i]->prepareNextState();
				
				// record success of updating
				if (timeObjects[i]->isNextStatePrepared())
					someObjectsUpdated = true;
				else
					allObjectsUpdated = false;
			}
		}
	}
	
	if (allObjectsUpdated)
		timePassed += dt;
	
	return allObjectsUpdated;
}